

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessbackend.cpp
# Opt level: O1

void __thiscall
QNetworkAccessBackend::proxyAuthenticationRequired
          (QNetworkAccessBackend *this,QNetworkProxy *proxy,QAuthenticator *authenticator)

{
  long lVar1;
  QNetworkAccessManagerPrivate *this_00;
  long in_FS_OFFSET;
  QUrl local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  this_00 = *(QNetworkAccessManagerPrivate **)(lVar1 + 0xa8);
  QUrl::QUrl(&local_40);
  QNetworkAccessManagerPrivate::proxyAuthenticationRequired
            (this_00,&local_40,proxy,*(bool *)(*(long *)(this + 8) + 0xb1),authenticator,
             (QNetworkProxy *)(*(long *)(lVar1 + 0xa0) + 0x290));
  QUrl::~QUrl(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessBackend::proxyAuthenticationRequired(const QNetworkProxy &proxy,
                                                        QAuthenticator *authenticator)
{
    Q_D(QNetworkAccessBackend);
    Q_ASSERT(authenticator);
    d->m_manager->proxyAuthenticationRequired(QUrl(), proxy, isSynchronous(), authenticator,
                                              &d->m_reply->lastProxyAuthentication);
}